

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O2

size_type __thiscall
google::protobuf::stringpiece_internal::StringPiece::find_last_of
          (StringPiece *this,StringPiece s,size_type pos)

{
  long lVar1;
  size_type sVar2;
  bool *table;
  char *pcVar3;
  ulong uVar4;
  size_type sVar5;
  StringPiece characters_wanted;
  bool lookup [256];
  
  pcVar3 = (char *)s.length_;
  sVar2 = this->length_;
  table = (bool *)CONCAT71((int7)(pos >> 8),pcVar3 == (char *)0x0 || sVar2 == 0);
  if (pcVar3 == (char *)0x0 || sVar2 == 0) {
    sVar2 = 0xffffffffffffffff;
  }
  else {
    if (pcVar3 == (char *)0x1) {
      sVar2 = rfind(this,(char)*(stringpiece_internal *)s.ptr_,pos);
      return sVar2;
    }
    memset(lookup,0,0x100);
    characters_wanted.length_ = (size_type)lookup;
    characters_wanted.ptr_ = pcVar3;
    BuildLookupTable((stringpiece_internal *)s.ptr_,characters_wanted,table);
    uVar4 = sVar2 - 1;
    if (pos <= sVar2 - 1) {
      uVar4 = pos;
    }
    sVar2 = uVar4 + 1;
    do {
      lVar1 = sVar2 - 1;
      sVar5 = sVar2 - 1;
      if (sVar2 == 1) break;
      sVar2 = sVar5;
    } while (lookup[(byte)this->ptr_[lVar1]] == false);
    sVar2 = 0xffffffffffffffff;
    if (lookup[(byte)this->ptr_[lVar1]] != false) {
      sVar2 = sVar5;
    }
  }
  return sVar2;
}

Assistant:

StringPiece::size_type StringPiece::find_last_of(StringPiece s,
                                                 size_type pos) const {
  if (empty() || s.empty()) return npos;
  // Avoid the cost of BuildLookupTable() for a single-character search.
  if (s.length_ == 1) return find_last_of(s.ptr_[0], pos);

  bool lookup[UCHAR_MAX + 1] = { false };
  BuildLookupTable(s, lookup);
  for (size_type i = std::min(pos, length_ - 1);; --i) {
    if (lookup[static_cast<unsigned char>(ptr_[i])]) {
      return i;
    }
    if (i == 0) break;
  }
  return npos;
}